

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

xmlChar * xmlCanonicPath(xmlChar *path)

{
  xmlChar *pxVar1;
  
  if (path == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  pxVar1 = xmlStrstr(path,"://");
  if (pxVar1 != (xmlChar *)0x0) {
    pxVar1 = xmlURIEscapeStr(path,(xmlChar *)":/?#[]@!$&()*+,;=\'%");
    return pxVar1;
  }
  pxVar1 = xmlStrdup(path);
  return pxVar1;
}

Assistant:

xmlChar *
xmlCanonicPath(const xmlChar *path)
{
    xmlChar *ret;

    if (path == NULL)
	return(NULL);

    /* Check if this is an "absolute uri" */
    if (xmlStrstr(path, BAD_CAST "://") != NULL) {
	/*
         * Escape all characters except reserved, unreserved and the
         * percent sign.
         *
         * xmlURIEscapeStr already keeps unreserved characters, so we
         * pass gen-delims, sub-delims and "%" to ignore.
         */
        ret = xmlURIEscapeStr(path, BAD_CAST ":/?#[]@!$&()*+,;='%");
    } else {
        ret = xmlStrdup((const xmlChar *) path);
    }

    return(ret);
}